

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,iu_basic_string_view<char,_std::char_traits<char>_> *expected,
          iu_basic_string_view<char,_std::char_traits<char>_> *actual)

{
  iu_basic_string_view<char,_std::char_traits<char>_> *actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_70;
  string local_50;
  iu_basic_string_view<char,_std::char_traits<char>_> *local_30;
  iu_basic_string_view<char,_std::char_traits<char>_> *actual_local;
  iu_basic_string_view<char,_std::char_traits<char>_> *expected_local;
  char *actual_str_local;
  char *expected_str_local;
  
  local_30 = expected;
  actual_local = (iu_basic_string_view<char,_std::char_traits<char>_> *)actual_str;
  expected_local = (iu_basic_string_view<char,_std::char_traits<char>_> *)expected_str;
  actual_str_local = (char *)this;
  expected_str_local = (char *)__return_storage_ptr__;
  bVar1 = iuOperatorEQ<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
                    (expected,(iu_basic_string_view<char,_std::char_traits<char>_> *)actual_str);
  expected_expression = actual_str_local;
  actual_expression = expected_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
              (&local_50,(internal *)actual_local,local_30,
               (iu_basic_string_view<char,_std::char_traits<char>_> *)actual_str);
    FormatForComparisonFailureMessage<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
              (&local_70,(internal *)local_30,actual_local,
               (iu_basic_string_view<char,_std::char_traits<char>_> *)actual_str);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }